

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void processEvent(XEvent *event)

{
  uint mods_00;
  uint plain_00;
  uint codepoint;
  int iVar1;
  unsigned_long uVar2;
  undefined4 local_410;
  int state;
  XEvent reply_2;
  char **paths;
  int local_340;
  int count_1;
  int i;
  int result;
  char *data;
  XEvent reply_1;
  int y_1;
  int x_1;
  int absY;
  int absX;
  XEvent reply;
  Atom protocol;
  int dy;
  int dx;
  int y;
  int x;
  int mods_3;
  int mods_2;
  XEvent next;
  int mods_1;
  int key_1;
  long character;
  KeySym keysym;
  char *c;
  char *chars;
  char buffer [100];
  int status;
  int count;
  int plain;
  int mods;
  int key;
  int filtered;
  int keycode;
  _GLFWwindow *window;
  XEvent *event_local;
  
  _filtered = (_GLFWwindow *)0x0;
  key = 0;
  mods = 0;
  if ((event->type == 2) || (event->type == 3)) {
    key = (event->xcrossing).detail;
  }
  if (_glfw.x11.im != (XIM)0x0) {
    mods = XFilterEvent(event);
  }
  if ((_glfw.x11.randr.available == 0) || (event->type != _glfw.x11.randr.eventBase + 1)) {
    if ((event->type == 0x23) ||
       (_filtered = findWindowByHandle((event->xany).window), _filtered != (_GLFWwindow *)0x0)) {
      switch(event->type) {
      case 2:
        iVar1 = translateKey(key);
        mods_00 = translateState((event->xcrossing).mode);
        plain_00 = (uint)(((mods_00 & 6) != 0 ^ 0xffU) & 1);
        if ((_filtered->x11).ic == (XIC)0x0) {
          XLookupString(event,0,0,&character);
          _glfwInputKey(_filtered,iVar1,key,1,mods_00);
          _mods_1 = _glfwKeySym2Unicode((uint)character);
          if (_mods_1 != -1) {
            _glfwInputChar(_filtered,(uint)_mods_1,mods_00,plain_00);
          }
        }
        else {
          if ((((_filtered->x11).lastKeyCode != key) ||
              ((_filtered->x11).lastKeyTime != (event->xkey).time)) && (key != 0)) {
            _glfwInputKey(_filtered,iVar1,key,1,mods_00);
          }
          (_filtered->x11).lastKeyCode = key;
          (_filtered->x11).lastKeyTime = (event->xkey).time;
          if (mods == 0) {
            c = (char *)&chars;
            buffer._96_4_ = Xutf8LookupString((_filtered->x11).ic,event,&chars,99,0,buffer + 0x5c);
            if (buffer._92_4_ == -1) {
              c = (char *)calloc((long)(buffer._96_4_ + 1),1);
              buffer._96_4_ =
                   Xutf8LookupString((_filtered->x11).ic,event,c,buffer._96_4_,0,buffer + 0x5c);
            }
            if ((buffer._92_4_ == 2) || (buffer._92_4_ == 4)) {
              keysym = (KeySym)c;
              c[(int)buffer._96_4_] = '\0';
              while ((long)(keysym - (long)c) < (long)(int)buffer._96_4_) {
                codepoint = decodeUTF8((char **)&keysym);
                _glfwInputChar(_filtered,codepoint,mods_00,plain_00);
              }
            }
            if ((char **)c != &chars) {
              free(c);
            }
          }
        }
        break;
      case 3:
        next.pad[0x17]._4_4_ = translateKey(key);
        next.pad[0x17]._0_4_ = translateState((event->xcrossing).mode);
        if (((((_glfw.x11.xkb.detectable != 0) ||
              (iVar1 = XEventsQueued(_glfw.x11.display,1), iVar1 == 0)) ||
             (XPeekEvent(_glfw.x11.display,&mods_3), mods_3 != 2)) ||
            ((next.xany.display != (Display *)(event->xany).window || (next.xkey.y_root != key))))
           || (0x13 < (long)next.xcookie.data - (event->xkey).time)) {
          _glfwInputKey(_filtered,next.pad[0x17]._4_4_,key,0,next.pad[0x17]._0_4_);
        }
        break;
      case 4:
        x = translateState((event->xcrossing).mode);
        if ((event->xkey).keycode == 1) {
          _glfwInputMouseClick(_filtered,0,1,x);
        }
        else if ((event->xkey).keycode == 2) {
          _glfwInputMouseClick(_filtered,2,1,x);
        }
        else if ((event->xkey).keycode == 3) {
          _glfwInputMouseClick(_filtered,1,1,x);
        }
        else if ((event->xkey).keycode == 4) {
          _glfwInputScroll(_filtered,0.0,1.0);
        }
        else if ((event->xkey).keycode == 5) {
          _glfwInputScroll(_filtered,0.0,-1.0);
        }
        else if ((event->xkey).keycode == 6) {
          _glfwInputScroll(_filtered,1.0,0.0);
        }
        else if ((event->xkey).keycode == 7) {
          _glfwInputScroll(_filtered,-1.0,0.0);
        }
        else {
          _glfwInputMouseClick(_filtered,(event->xkey).keycode - 5,1,x);
        }
        break;
      case 5:
        y = translateState((event->xcrossing).mode);
        if ((event->xkey).keycode == 1) {
          _glfwInputMouseClick(_filtered,0,0,y);
        }
        else if ((event->xkey).keycode == 2) {
          _glfwInputMouseClick(_filtered,2,0,y);
        }
        else if ((event->xkey).keycode == 3) {
          _glfwInputMouseClick(_filtered,1,0,y);
        }
        else if (7 < (event->xkey).keycode) {
          _glfwInputMouseClick(_filtered,(event->xkey).keycode - 5,0,y);
        }
        break;
      case 6:
        dx = (event->xkey).x;
        dy = (event->xkey).y;
        if ((dx != (_filtered->x11).warpCursorPosX) || (dy != (_filtered->x11).warpCursorPosY)) {
          if (_filtered->cursorMode == 0x34003) {
            if (_glfw.x11.disabledCursorWindow != _filtered) {
              return;
            }
            protocol._4_4_ = dx - (_filtered->x11).lastCursorPosX;
            protocol._0_4_ = dy - (_filtered->x11).lastCursorPosY;
            _glfwInputCursorPos(_filtered,_filtered->virtualCursorPosX + (double)protocol._4_4_,
                                _filtered->virtualCursorPosY + (double)(int)protocol);
          }
          else {
            _glfwInputCursorPos(_filtered,(double)dx,(double)dy);
          }
        }
        (_filtered->x11).lastCursorPosX = dx;
        (_filtered->x11).lastCursorPosY = dy;
        break;
      case 7:
        if (_filtered->cursorMode == 0x34002) {
          _glfwPlatformSetCursorMode(_filtered,0x34002);
        }
        _glfwInputCursorEnter(_filtered,1);
        break;
      case 8:
        _glfwInputCursorEnter(_filtered,0);
        break;
      case 9:
        if (_filtered->cursorMode == 0x34003) {
          _glfwPlatformSetCursorMode(_filtered,0x34003);
        }
        if (((event->xfocus).mode != 1) && ((event->xfocus).mode != 2)) {
          if ((_filtered->x11).ic != (XIC)0x0) {
            XSetICFocus((_filtered->x11).ic);
          }
          _glfwInputWindowFocus(_filtered,1);
        }
        break;
      case 10:
        if (_filtered->cursorMode == 0x34003) {
          _glfwPlatformSetCursorMode(_filtered,0x34001);
        }
        if (((event->xfocus).mode != 1) && ((event->xfocus).mode != 2)) {
          if ((_filtered->x11).ic != (XIC)0x0) {
            XUnsetICFocus((_filtered->x11).ic);
          }
          if ((_filtered->monitor != (_GLFWmonitor *)0x0) && (_filtered->autoIconify != 0)) {
            _glfwPlatformIconifyWindow(_filtered);
          }
          _glfwInputWindowFocus(_filtered,0);
        }
        break;
      case 0xc:
        _glfwInputWindowDamage(_filtered);
        break;
      case 0x11:
        break;
      case 0x16:
        if (((event->xexpose).count != (_filtered->x11).width) ||
           ((event->xgraphicsexpose).major_code != (_filtered->x11).height)) {
          _glfwInputFramebufferSize
                    (_filtered,(event->xexpose).count,(event->xgraphicsexpose).major_code);
          _glfwInputWindowSize(_filtered,(event->xexpose).count,(event->xgraphicsexpose).major_code)
          ;
          (_filtered->x11).width = (event->xexpose).count;
          (_filtered->x11).height = (event->xgraphicsexpose).major_code;
        }
        if ((((event->xexpose).width != (_filtered->x11).xpos) ||
            ((event->xexpose).height != (_filtered->x11).ypos)) &&
           (((_filtered->x11).overrideRedirect != 0 || ((event->xany).send_event != 0)))) {
          _glfwInputWindowPos(_filtered,(event->xexpose).width,(event->xexpose).height);
          (_filtered->x11).xpos = (event->xexpose).width;
          (_filtered->x11).ypos = (event->xexpose).height;
        }
        break;
      case 0x1c:
        if (((event->xkey).root == _glfw.x11.WM_STATE) && ((event->xexpose).count == 0)) {
          iVar1 = getWindowState(_filtered);
          if (iVar1 == 3) {
            if (_filtered->monitor != (_GLFWmonitor *)0x0) {
              releaseMonitor(_filtered);
            }
            _glfwInputWindowIconify(_filtered,1);
          }
          else if (iVar1 == 1) {
            if (_filtered->monitor != (_GLFWmonitor *)0x0) {
              acquireMonitor(_filtered);
            }
            _glfwInputWindowIconify(_filtered,0);
          }
        }
        break;
      case 0x1d:
        handleSelectionClear(event);
        break;
      case 0x1e:
        handleSelectionRequest(event);
        break;
      case 0x1f:
        if ((event->xkey).time != 0) {
          uVar2 = _glfwGetWindowPropertyX11
                            ((event->xany).window,(event->xselectionrequest).target,
                             (event->xselectionrequest).selection,(uchar **)&i);
          count_1 = (int)uVar2;
          if (count_1 != 0) {
            reply_2.pad[0x17] = (long)parseUriList((char *)_i,(int *)((long)&paths + 4));
            _glfwInputDrop(_filtered,paths._4_4_,(char **)reply_2.pad[0x17]);
            for (local_340 = 0; local_340 < paths._4_4_; local_340 = local_340 + 1) {
              free(*(void **)(reply_2.pad[0x17] + (long)local_340 * 8));
            }
            free((void *)reply_2.pad[0x17]);
          }
          XFree(_i);
          memset(&local_410,0,0xc0);
          local_410 = 0x21;
          reply_2.xany.display = (Display *)_glfw.x11.xdnd.source;
          reply_2.xany.window = _glfw.x11.XdndFinished;
          reply_2.xfocus.mode = 0x20;
          reply_2.xkey.subwindow = (_filtered->x11).handle;
          reply_2.xkey.time = (Time)count_1;
          reply_2.xselectionrequest.property = _glfw.x11.XdndActionCopy;
          XSendEvent(_glfw.x11.display,_glfw.x11.xdnd.source,0,0,&local_410);
          XFlush(_glfw.x11.display);
        }
        break;
      case 0x21:
        if ((mods == 0) && ((event->xkey).root != 0)) {
          if ((event->xkey).root == _glfw.x11.WM_PROTOCOLS) {
            reply.pad[0x17] = (event->xkey).time;
            if (reply.pad[0x17] != 0) {
              if (reply.pad[0x17] == _glfw.x11.WM_DELETE_WINDOW) {
                _glfwInputWindowCloseRequest(_filtered);
              }
              else if (reply.pad[0x17] == _glfw.x11.NET_WM_PING) {
                memcpy(&absY,event,0xc0);
                reply.xerror.serial = _glfw.x11.root;
                XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&absY);
              }
            }
          }
          else if ((event->xkey).root != _glfw.x11.XdndEnter) {
            if ((event->xkey).root == _glfw.x11.XdndDrop) {
              _glfw.x11.xdnd.source = (event->xkey).time;
              XConvertSelection(_glfw.x11.display,_glfw.x11.XdndSelection,_glfw.x11.UTF8_STRING,
                                _glfw.x11.XdndSelection,(_filtered->x11).handle,0);
            }
            else if ((event->xkey).root == _glfw.x11.XdndPosition) {
              x_1 = (uint)((event->xconfigure).above >> 0x10) & 0xffff;
              y_1 = (uint)(event->xconfigure).above & 0xffff;
              _glfwPlatformGetWindowPos
                        (_filtered,(int *)((long)&reply_1 + 0xbc),(int *)(reply_1.pad + 0x17));
              _glfwInputCursorPos(_filtered,(double)(x_1 - reply_1._188_4_),
                                  (double)(y_1 - reply_1._184_4_));
              memset(&data,0,0xc0);
              data._0_4_ = 0x21;
              reply_1.xany.display = (Display *)(event->xkey).time;
              reply_1.xany.window = _glfw.x11.XdndStatus;
              reply_1.xfocus.mode = 0x20;
              reply_1.xkey.subwindow = (_filtered->x11).handle;
              reply_1.xkey.time = 1;
              reply_1.xselectionrequest.property = 0;
              reply_1.xconfigure.above = 0;
              reply_1.pad[10] = _glfw.x11.XdndActionCopy;
              XSendEvent(_glfw.x11.display,(event->xkey).time,0,0,&data);
              XFlush(_glfw.x11.display);
            }
          }
        }
      }
    }
  }
  else {
    XRRUpdateConfiguration(event);
    _glfwInputMonitorChange();
  }
  return;
}

Assistant:

static void processEvent(XEvent *event)
{
    _GLFWwindow* window = NULL;
    int keycode = 0;
    Bool filtered = False;

    // HACK: Save scancode as some IMs clear the field in XFilterEvent
    if (event->type == KeyPress || event->type == KeyRelease)
        keycode = event->xkey.keycode;

    if (_glfw.x11.im)
        filtered = XFilterEvent(event, None);

    if (_glfw.x11.randr.available)
    {
        if (event->type == _glfw.x11.randr.eventBase + RRNotify)
        {
            XRRUpdateConfiguration(event);
            _glfwInputMonitorChange();
            return;
        }
    }

    if (event->type != GenericEvent)
    {
        window = findWindowByHandle(event->xany.window);
        if (window == NULL)
        {
            // This is an event for a window that has already been destroyed
            return;
        }
    }

    switch (event->type)
    {
        case KeyPress:
        {
            const int key = translateKey(keycode);
            const int mods = translateState(event->xkey.state);
            const int plain = !(mods & (GLFW_MOD_CONTROL | GLFW_MOD_ALT));

            if (window->x11.ic)
            {
                // HACK: Ignore duplicate key press events generated by ibus
                //       Corresponding release events are filtered out by the
                //       GLFW key repeat logic
                if (window->x11.lastKeyCode != keycode ||
                    window->x11.lastKeyTime != event->xkey.time)
                {
                    if (keycode)
                        _glfwInputKey(window, key, keycode, GLFW_PRESS, mods);
                }

                window->x11.lastKeyCode = keycode;
                window->x11.lastKeyTime = event->xkey.time;

                if (!filtered)
                {
                    int count;
                    Status status;
#if defined(X_HAVE_UTF8_STRING)
                    char buffer[100];
                    char* chars = buffer;

                    count = Xutf8LookupString(window->x11.ic,
                                              &event->xkey,
                                              buffer, sizeof(buffer) - 1,
                                              NULL, &status);

                    if (status == XBufferOverflow)
                    {
                        chars = calloc(count + 1, 1);
                        count = Xutf8LookupString(window->x11.ic,
                                                  &event->xkey,
                                                  chars, count,
                                                  NULL, &status);
                    }

                    if (status == XLookupChars || status == XLookupBoth)
                    {
                        const char* c = chars;
                        chars[count] = '\0';
                        while (c - chars < count)
                            _glfwInputChar(window, decodeUTF8(&c), mods, plain);
                    }
#else /*X_HAVE_UTF8_STRING*/
                    wchar_t buffer[16];
                    wchar_t* chars = buffer;

                    count = XwcLookupString(window->x11.ic,
                                            &event->xkey,
                                            buffer, sizeof(buffer) / sizeof(wchar_t),
                                            NULL, &status);

                    if (status == XBufferOverflow)
                    {
                        chars = calloc(count, sizeof(wchar_t));
                        count = XwcLookupString(window->x11.ic,
                                                &event->xkey,
                                                chars, count,
                                                NULL, &status);
                    }

                    if (status == XLookupChars || status == XLookupBoth)
                    {
                        int i;
                        for (i = 0;  i < count;  i++)
                            _glfwInputChar(window, chars[i], mods, plain);
                    }
#endif /*X_HAVE_UTF8_STRING*/

                    if (chars != buffer)
                        free(chars);
                }
            }
            else
            {
                KeySym keysym;
                XLookupString(&event->xkey, NULL, 0, &keysym, NULL);

                _glfwInputKey(window, key, keycode, GLFW_PRESS, mods);

                const long character = _glfwKeySym2Unicode(keysym);
                if (character != -1)
                    _glfwInputChar(window, character, mods, plain);
            }

            return;
        }

        case KeyRelease:
        {
            const int key = translateKey(keycode);
            const int mods = translateState(event->xkey.state);

            if (!_glfw.x11.xkb.detectable)
            {
                // HACK: Key repeat events will arrive as KeyRelease/KeyPress
                //       pairs with similar or identical time stamps
                //       The key repeat logic in _glfwInputKey expects only key
                //       presses to repeat, so detect and discard release events
                if (XEventsQueued(_glfw.x11.display, QueuedAfterReading))
                {
                    XEvent next;
                    XPeekEvent(_glfw.x11.display, &next);

                    if (next.type == KeyPress &&
                        next.xkey.window == event->xkey.window &&
                        next.xkey.keycode == keycode)
                    {
                        // HACK: The time of repeat events sometimes doesn't
                        //       match that of the press event, so add an
                        //       epsilon
                        //       Toshiyuki Takahashi can press a button
                        //       16 times per second so it's fairly safe to
                        //       assume that no human is pressing the key 50
                        //       times per second (value is ms)
                        if ((next.xkey.time - event->xkey.time) < 20)
                        {
                            // This is very likely a server-generated key repeat
                            // event, so ignore it
                            return;
                        }
                    }
                }
            }

            _glfwInputKey(window, key, keycode, GLFW_RELEASE, mods);
            return;
        }

        case ButtonPress:
        {
            const int mods = translateState(event->xbutton.state);

            if (event->xbutton.button == Button1)
                _glfwInputMouseClick(window, GLFW_MOUSE_BUTTON_LEFT, GLFW_PRESS, mods);
            else if (event->xbutton.button == Button2)
                _glfwInputMouseClick(window, GLFW_MOUSE_BUTTON_MIDDLE, GLFW_PRESS, mods);
            else if (event->xbutton.button == Button3)
                _glfwInputMouseClick(window, GLFW_MOUSE_BUTTON_RIGHT, GLFW_PRESS, mods);

            // Modern X provides scroll events as mouse button presses
            else if (event->xbutton.button == Button4)
                _glfwInputScroll(window, 0.0, 1.0);
            else if (event->xbutton.button == Button5)
                _glfwInputScroll(window, 0.0, -1.0);
            else if (event->xbutton.button == Button6)
                _glfwInputScroll(window, 1.0, 0.0);
            else if (event->xbutton.button == Button7)
                _glfwInputScroll(window, -1.0, 0.0);

            else
            {
                // Additional buttons after 7 are treated as regular buttons
                // We subtract 4 to fill the gap left by scroll input above
                _glfwInputMouseClick(window,
                                     event->xbutton.button - Button1 - 4,
                                     GLFW_PRESS,
                                     mods);
            }

            return;
        }

        case ButtonRelease:
        {
            const int mods = translateState(event->xbutton.state);

            if (event->xbutton.button == Button1)
            {
                _glfwInputMouseClick(window,
                                     GLFW_MOUSE_BUTTON_LEFT,
                                     GLFW_RELEASE,
                                     mods);
            }
            else if (event->xbutton.button == Button2)
            {
                _glfwInputMouseClick(window,
                                     GLFW_MOUSE_BUTTON_MIDDLE,
                                     GLFW_RELEASE,
                                     mods);
            }
            else if (event->xbutton.button == Button3)
            {
                _glfwInputMouseClick(window,
                                     GLFW_MOUSE_BUTTON_RIGHT,
                                     GLFW_RELEASE,
                                     mods);
            }
            else if (event->xbutton.button > Button7)
            {
                // Additional buttons after 7 are treated as regular buttons
                // We subtract 4 to fill the gap left by scroll input above
                _glfwInputMouseClick(window,
                                     event->xbutton.button - Button1 - 4,
                                     GLFW_RELEASE,
                                     mods);
            }

            return;
        }

        case EnterNotify:
        {
            // HACK: This is a workaround for WMs (KWM, Fluxbox) that otherwise
            //       ignore the defined cursor for hidden cursor mode
            if (window->cursorMode == GLFW_CURSOR_HIDDEN)
                _glfwPlatformSetCursorMode(window, GLFW_CURSOR_HIDDEN);

            _glfwInputCursorEnter(window, GLFW_TRUE);
            return;
        }

        case LeaveNotify:
        {
            _glfwInputCursorEnter(window, GLFW_FALSE);
            return;
        }

        case MotionNotify:
        {
            const int x = event->xmotion.x;
            const int y = event->xmotion.y;

            if (x != window->x11.warpCursorPosX || y != window->x11.warpCursorPosY)
            {
                // The cursor was moved by something other than GLFW

                if (window->cursorMode == GLFW_CURSOR_DISABLED)
                {
                    if (_glfw.x11.disabledCursorWindow != window)
                        return;

                    const int dx = x - window->x11.lastCursorPosX;
                    const int dy = y - window->x11.lastCursorPosY;

                    _glfwInputCursorPos(window,
                                        window->virtualCursorPosX + dx,
                                        window->virtualCursorPosY + dy);
                }
                else
                    _glfwInputCursorPos(window, x, y);
            }

            window->x11.lastCursorPosX = x;
            window->x11.lastCursorPosY = y;
            return;
        }

        case ConfigureNotify:
        {
            if (event->xconfigure.width != window->x11.width ||
                event->xconfigure.height != window->x11.height)
            {
                _glfwInputFramebufferSize(window,
                                          event->xconfigure.width,
                                          event->xconfigure.height);

                _glfwInputWindowSize(window,
                                     event->xconfigure.width,
                                     event->xconfigure.height);

                window->x11.width = event->xconfigure.width;
                window->x11.height = event->xconfigure.height;
            }

            if (event->xconfigure.x != window->x11.xpos ||
                event->xconfigure.y != window->x11.ypos)
            {
                if (window->x11.overrideRedirect || event->xany.send_event)
                {
                    _glfwInputWindowPos(window,
                                        event->xconfigure.x,
                                        event->xconfigure.y);

                    window->x11.xpos = event->xconfigure.x;
                    window->x11.ypos = event->xconfigure.y;
                }
            }

            return;
        }

        case ClientMessage:
        {
            // Custom client message, probably from the window manager

            if (filtered)
                return;

            if (event->xclient.message_type == None)
                return;

            if (event->xclient.message_type == _glfw.x11.WM_PROTOCOLS)
            {
                const Atom protocol = event->xclient.data.l[0];
                if (protocol == None)
                    return;

                if (protocol == _glfw.x11.WM_DELETE_WINDOW)
                {
                    // The window manager was asked to close the window, for example by
                    // the user pressing a 'close' window decoration button
                    _glfwInputWindowCloseRequest(window);
                }
                else if (protocol == _glfw.x11.NET_WM_PING)
                {
                    // The window manager is pinging the application to ensure it's
                    // still responding to events

                    XEvent reply = *event;
                    reply.xclient.window = _glfw.x11.root;

                    XSendEvent(_glfw.x11.display, _glfw.x11.root,
                               False,
                               SubstructureNotifyMask | SubstructureRedirectMask,
                               &reply);
                }
            }
            else if (event->xclient.message_type == _glfw.x11.XdndEnter)
            {
                // A drag operation has entered the window
                // TODO: Check if UTF-8 string is supported by the source
            }
            else if (event->xclient.message_type == _glfw.x11.XdndDrop)
            {
                // The drag operation has finished dropping on
                // the window, ask to convert it to a UTF-8 string
                _glfw.x11.xdnd.source = event->xclient.data.l[0];
                XConvertSelection(_glfw.x11.display,
                                  _glfw.x11.XdndSelection,
                                  _glfw.x11.UTF8_STRING,
                                  _glfw.x11.XdndSelection,
                                  window->x11.handle, CurrentTime);
            }
            else if (event->xclient.message_type == _glfw.x11.XdndPosition)
            {
                // The drag operation has moved over the window
                const int absX = (event->xclient.data.l[2] >> 16) & 0xFFFF;
                const int absY = (event->xclient.data.l[2]) & 0xFFFF;
                int x, y;

                _glfwPlatformGetWindowPos(window, &x, &y);
                _glfwInputCursorPos(window, absX - x, absY - y);

                // Reply that we are ready to copy the dragged data
                XEvent reply;
                memset(&reply, 0, sizeof(reply));

                reply.type = ClientMessage;
                reply.xclient.window = event->xclient.data.l[0];
                reply.xclient.message_type = _glfw.x11.XdndStatus;
                reply.xclient.format = 32;
                reply.xclient.data.l[0] = window->x11.handle;
                reply.xclient.data.l[1] = 1; // Always accept the dnd with no rectangle
                reply.xclient.data.l[2] = 0; // Specify an empty rectangle
                reply.xclient.data.l[3] = 0;
                reply.xclient.data.l[4] = _glfw.x11.XdndActionCopy;

                XSendEvent(_glfw.x11.display, event->xclient.data.l[0],
                           False, NoEventMask, &reply);
                XFlush(_glfw.x11.display);
            }

            return;
        }

        case SelectionNotify:
        {
            if (event->xselection.property)
            {
                // The converted data from the drag operation has arrived
                char* data;
                const int result =
                    _glfwGetWindowPropertyX11(event->xselection.requestor,
                                              event->xselection.property,
                                              event->xselection.target,
                                              (unsigned char**) &data);

                if (result)
                {
                    int i, count;
                    char** paths = parseUriList(data, &count);

                    _glfwInputDrop(window, count, (const char**) paths);

                    for (i = 0;  i < count;  i++)
                        free(paths[i]);
                    free(paths);
                }

                XFree(data);

                XEvent reply;
                memset(&reply, 0, sizeof(reply));

                reply.type = ClientMessage;
                reply.xclient.window = _glfw.x11.xdnd.source;
                reply.xclient.message_type = _glfw.x11.XdndFinished;
                reply.xclient.format = 32;
                reply.xclient.data.l[0] = window->x11.handle;
                reply.xclient.data.l[1] = result;
                reply.xclient.data.l[2] = _glfw.x11.XdndActionCopy;

                // Reply that all is well
                XSendEvent(_glfw.x11.display, _glfw.x11.xdnd.source,
                           False, NoEventMask, &reply);
                XFlush(_glfw.x11.display);
            }

            return;
        }

        case FocusIn:
        {
            if (window->cursorMode == GLFW_CURSOR_DISABLED)
                _glfwPlatformSetCursorMode(window, GLFW_CURSOR_DISABLED);

            if (event->xfocus.mode == NotifyGrab ||
                event->xfocus.mode == NotifyUngrab)
            {
                // Ignore focus events from popup indicator windows, window menu
                // key chords and window dragging
                return;
            }

            if (window->x11.ic)
                XSetICFocus(window->x11.ic);

            _glfwInputWindowFocus(window, GLFW_TRUE);
            return;
        }

        case FocusOut:
        {
            if (window->cursorMode == GLFW_CURSOR_DISABLED)
                _glfwPlatformSetCursorMode(window, GLFW_CURSOR_NORMAL);

            if (event->xfocus.mode == NotifyGrab ||
                event->xfocus.mode == NotifyUngrab)
            {
                // Ignore focus events from popup indicator windows, window menu
                // key chords and window dragging
                return;
            }

            if (window->x11.ic)
                XUnsetICFocus(window->x11.ic);

            if (window->monitor && window->autoIconify)
                _glfwPlatformIconifyWindow(window);

            _glfwInputWindowFocus(window, GLFW_FALSE);
            return;
        }

        case Expose:
        {
            _glfwInputWindowDamage(window);
            return;
        }

        case PropertyNotify:
        {
            if (event->xproperty.atom == _glfw.x11.WM_STATE &&
                event->xproperty.state == PropertyNewValue)
            {
                const int state = getWindowState(window);
                if (state == IconicState)
                {
                    if (window->monitor)
                        releaseMonitor(window);

                    _glfwInputWindowIconify(window, GLFW_TRUE);
                }
                else if (state == NormalState)
                {
                    if (window->monitor)
                        acquireMonitor(window);

                    _glfwInputWindowIconify(window, GLFW_FALSE);
                }
            }

            return;
        }

        case SelectionClear:
        {
            handleSelectionClear(event);
            return;
        }

        case SelectionRequest:
        {
            handleSelectionRequest(event);
            return;
        }

        case DestroyNotify:
            return;
    }
}